

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void act_clause_bump(sat_solver3 *s,clause *c)

{
  float *pfVar1;
  int *piVar2;
  uint *puVar3;
  float *act_1;
  uint *act;
  clause *c_local;
  sat_solver3 *s_local;
  
  if (s->ClaActType == 0) {
    piVar2 = veci_begin(&s->act_clas);
    puVar3 = (uint *)(piVar2 + (int)c[(ulong)((uint)*c >> 0xb) + 1]);
    *puVar3 = s->cla_inc + *puVar3;
    if ((*puVar3 & 0x80000000) != 0) {
      act_clause_rescale(s);
    }
  }
  else {
    piVar2 = veci_begin(&s->act_clas);
    pfVar1 = (float *)(piVar2 + (int)c[(ulong)((uint)*c >> 0xb) + 1]);
    *pfVar1 = (float)s->cla_inc + *pfVar1;
    if (1e+20 < *pfVar1) {
      act_clause_rescale(s);
    }
  }
  return;
}

Assistant:

static inline void act_clause_bump(sat_solver* s, clause *c) 
{
    if ( s->ClaActType == 0 )
    {
        unsigned* act = (unsigned *)veci_begin(&s->act_clas) + c->lits[c->size];
        *act += s->cla_inc;
        if ( *act & 0x80000000 )
            act_clause_rescale(s);
    }
    else
    {
        float* act = (float *)veci_begin(&s->act_clas) + c->lits[c->size];
        *act += s->cla_inc;
        if (*act > 1e20) 
            act_clause_rescale(s);
    }
}